

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_hostapi_skeleton.c
# Opt level: O0

PaError CloseStream(PaStream *s)

{
  PaUtilStreamRepresentation *in_RDI;
  PaAlsaStream *stream;
  PaError result;
  undefined4 in_stack_fffffffffffffff0;
  PaError PVar1;
  
  PVar1 = 0;
  PaUtil_TerminateBufferProcessor((PaUtilBufferProcessor *)0x114de7);
  PaUtil_TerminateStreamRepresentation(in_RDI);
  PaAlsaStream_Terminate((PaAlsaStream *)CONCAT44(PVar1,in_stack_fffffffffffffff0));
  return PVar1;
}

Assistant:

static PaError CloseStream( PaStream* s )
{
    PaError result = paNoError;
    PaSkeletonStream *stream = (PaSkeletonStream*)s;

    /*
        IMPLEMENT ME:
            - additional stream closing + cleanup
    */

    PaUtil_TerminateBufferProcessor( &stream->bufferProcessor );
    PaUtil_TerminateStreamRepresentation( &stream->streamRepresentation );
    PaUtil_FreeMemory( stream );

    return result;
}